

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall docopt::Command::~Command(Command *this)

{
  LeafPattern::~LeafPattern((LeafPattern *)this);
  operator_delete(this);
  return;
}

Assistant:

Command(std::string name, value v = value{false})
		: Argument(std::move(name), std::move(v))
		{}